

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Generators_Uniform2D_Test::TestBody(Generators_Uniform2D_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  char *message;
  char *in_R9;
  float fVar4;
  undefined1 auVar5 [64];
  int count;
  AssertionResult gtest_ar_;
  Uniform2DIter __begin1;
  AssertionResult gtest_ar;
  int local_8c;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  Uniform2DIter local_70;
  string local_58;
  AssertHelper local_38;
  undefined1 extraout_var [56];
  
  local_8c = 0;
  local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = 0;
  local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.n = 0x20;
  local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.inc = 1;
  local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.state =
       (uint64_t)&DAT_5851f42d4c957f2e;
  do {
    auVar5._0_8_ = pbrt::detail::Uniform2DIter::operator*(&local_70);
    auVar5._8_56_ = extraout_var;
    if ((auVar5._0_4_ < 0.0) || (1.0 <= auVar5._0_4_)) {
LAB_0031b1bb:
      local_88.data_._0_1_ = (internal)0x0;
LAB_0031b1c9:
      local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,(internal *)&local_88,
                 (AssertionResult *)"u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x458,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                         (char)local_58._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    else {
      auVar1 = vmovshdup_avx(auVar5._0_16_);
      fVar4 = auVar1._0_4_;
      if (fVar4 < 0.0) goto LAB_0031b1bb;
      local_88.data_._0_1_ = (internal)(fVar4 < 1.0);
      local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (1.0 <= fVar4) goto LAB_0031b1c9;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_8c = local_8c + 1;
    iVar3 = local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
            super_IndexingIterator<pbrt::detail::Uniform2DIter>.i + 1;
    local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
    super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = iVar3;
    if (iVar3 == 0x20) {
      local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
      super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = 0x20;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_58,"32","count",(int *)&local_70,&local_8c);
      if ((char)local_58._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(char **)local_58._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x45b,message);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
            super_IndexingIterator<pbrt::detail::Uniform2DIter> !=
            (IndexingIterator<pbrt::detail::Uniform2DIter>)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
              super_IndexingIterator<pbrt::detail::Uniform2DIter> !=
              (IndexingIterator<pbrt::detail::Uniform2DIter>)0x0)) {
            (**(code **)(*(long *)local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
                                  super_IndexingIterator<pbrt::detail::Uniform2DIter> + 8))();
          }
          local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
          super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = 0;
          local_70.super_RNGIterator<pbrt::detail::Uniform2DIter>.
          super_IndexingIterator<pbrt::detail::Uniform2DIter>.n = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_58._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  } while( true );
}

Assistant:

TEST(Generators, Uniform2D) {
    int count = 0;
    for (Point2f u : Uniform2D(32)) {
        EXPECT_TRUE(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
        ++count;
    }
    EXPECT_EQ(32, count);
}